

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O0

void pbrt::PrintStackTrace(void)

{
  undefined8 uVar1;
  bool bVar2;
  char *optr;
  char *fptr;
  char *mptr;
  char *ptr;
  char *demangledFunctionSymbol;
  int validCppName;
  char offset [64];
  char functionSymbol [1024];
  char moduleName [1024];
  int i;
  char **strs;
  int frames;
  void *callstack [32];
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  int local_96c;
  char local_968 [64];
  char local_928 [1024];
  char local_528 [1036];
  int local_11c;
  void *local_118;
  int local_10c;
  undefined8 local_108 [33];
  
  local_10c = backtrace(local_108,0x20);
  local_118 = (void *)backtrace_symbols(local_108);
  local_11c = 0;
  do {
    if (local_10c <= local_11c) {
      free(local_118);
      return;
    }
    memset(local_528,0,0x400);
    memset(local_928,0,0x400);
    memset(local_968,0,0x40);
    local_96c = 0;
    local_988 = local_528;
    local_980 = *(char **)((long)local_118 + (long)local_11c * 8);
    while( true ) {
      bVar2 = false;
      if (*local_980 != '\0') {
        bVar2 = *local_980 != '(';
      }
      if (!bVar2) break;
      *local_988 = *local_980;
      local_988 = local_988 + 1;
      local_980 = local_980 + 1;
    }
    *local_988 = '\0';
    if (local_980[1] == '+') {
      strcpy(local_928,"(unknown)");
      local_980 = local_980 + 2;
LAB_00870cfe:
      local_998 = local_968;
      while( true ) {
        bVar2 = false;
        if (*local_980 != '\0') {
          bVar2 = *local_980 != ')';
        }
        if (!bVar2) break;
        *local_998 = *local_980;
        local_998 = local_998 + 1;
        local_980 = local_980 + 1;
      }
      *local_998 = '\0';
      local_96c = 0;
      uVar1 = __cxa_demangle(local_928,0,0,&local_96c);
      if (local_96c == 0) {
        fprintf(_stderr,"(%-40s)\t0x%p - %s + %s\n",local_528,local_108[local_11c],uVar1,local_968);
      }
      else {
        fprintf(_stderr,"(%-40s)\t0x%p - %s + %s\n",local_528,local_108[local_11c],local_928,
                local_968);
      }
    }
    else {
      local_990 = local_928;
      local_980 = local_980 + 1;
      while( true ) {
        bVar2 = false;
        if (*local_980 != '\0') {
          bVar2 = *local_980 != '+';
        }
        if (!bVar2) break;
        *local_990 = *local_980;
        local_990 = local_990 + 1;
        local_980 = local_980 + 1;
      }
      *local_990 = '\0';
      if (*local_980 == '+') {
        local_980 = local_980 + 1;
        goto LAB_00870cfe;
      }
      fprintf(_stderr,"Unable to decode frame: %s\n",
              *(undefined8 *)((long)local_118 + (long)local_11c * 8));
    }
    local_11c = local_11c + 1;
  } while( true );
}

Assistant:

void PrintStackTrace() {
#if defined(PBRT_IS_OSX)
    void* callstack[32];
    int frames = backtrace(callstack, PBRT_ARRAYSIZE(callstack));
    char** strs = backtrace_symbols(callstack, frames);
    for (int i = 0; i < frames; ++i) {
        // https://www.variadic.xyz/2013/04/14/generating-stack-trace-on-os-x/
        char functionSymbol[1024] = {};
        char moduleName[1024] = {};
        int offset = 0;
        char addr[48] = {};

        // split the string, take out chunks out of stack trace
        // we are primarily interested in module, function and address
        sscanf(strs[i], "%*s %s %s %s %*s %d", moduleName, addr, functionSymbol, &offset);

        if (strcmp(moduleName, "pbrt") != 0)
            // We've past the pbrt stack frames
            break;

        int validCppName = 0;
        char* functionName = abi::__cxa_demangle(functionSymbol, NULL, 0, &validCppName);

        char stackFrame[4096] = {};
        if (validCppName == 0)
            fprintf(stderr, "(%s)\t0x%s - %s + %d\n", moduleName, addr, functionName,
                    offset);
        else
            fprintf(stderr, "(%s)\t0x%s - %s + %d\n", moduleName, addr, functionSymbol,
                    offset);
    }
    free(strs);
#elif defined(PBRT_IS_LINUX)
    void *callstack[32];
    int frames = backtrace(callstack, PBRT_ARRAYSIZE(callstack));
    char **strs = backtrace_symbols(callstack, frames);
    for (int i = 0; i < frames; ++i) {
        char moduleName[1024] = {};
        char functionSymbol[1024] = {};
        char offset[64] = {};
        int validCppName = 0;
        char *demangledFunctionSymbol = nullptr;

        const char *ptr = strs[i];
        char *mptr = moduleName;
        while (*ptr && *ptr != '(')
            *mptr++ = *ptr++;
        *mptr = '\0';
        ++ptr;
        if (*ptr == '+') {
            strcpy(functionSymbol, "(unknown)");
            ++ptr;
        } else {
            // Copy mangled function name
            char *fptr = functionSymbol;
            while (*ptr && *ptr != '+')
                *fptr++ = *ptr++;
            *fptr = '\0';

            if (*ptr != '+') {
                fprintf(stderr, "Unable to decode frame: %s\n", strs[i]);
                continue;
            }
            ++ptr;
        }

        char *optr = offset;
        while (*ptr && *ptr != ')')
            *optr++ = *ptr++;
        *optr = '\0';

        validCppName = 0;
        demangledFunctionSymbol =
            abi::__cxa_demangle(functionSymbol, NULL, 0, &validCppName);

        if (validCppName == 0)
            fprintf(stderr, "(%-40s)\t0x%p - %s + %s\n", moduleName, callstack[i],
                    demangledFunctionSymbol, offset);
        else
            fprintf(stderr, "(%-40s)\t0x%p - %s + %s\n", moduleName, callstack[i],
                    functionSymbol, offset);
    }
    free(strs);
#elif defined(PBRT_IS_WINDOWS)
    // Via
    // https://stackoverflow.com/questions/22467604/how-can-you-use-capturestackbacktrace-to-capture-the-exception-stack-not-the-ca
    void *stack[32];
    constexpr int maxNameLength = 1024;
    HANDLE process = GetCurrentProcess();
    SymInitialize(process, NULL, TRUE);
    WORD nFrames = CaptureStackBackTrace(0, PBRT_ARRAYSIZE(stack), stack, NULL);
    SYMBOL_INFO *symbol =
        (SYMBOL_INFO *)malloc(sizeof(SYMBOL_INFO) + (maxNameLength - 1) * sizeof(TCHAR));
    symbol->MaxNameLen = maxNameLength;
    symbol->SizeOfStruct = sizeof(SYMBOL_INFO);
    DWORD displacement;
    IMAGEHLP_LINE64 *line = (IMAGEHLP_LINE64 *)malloc(sizeof(IMAGEHLP_LINE64));
    line->SizeOfStruct = sizeof(IMAGEHLP_LINE64);
    for (int i = 0; i < nFrames; ++i) {
        DWORD64 address = (DWORD64)(stack[i]);
        SymFromAddr(process, address, NULL, symbol);
        if (SymGetLineFromAddr64(process, address, &displacement, line))
            fprintf(stderr, "(%-40s)\t0x%p - %s + line %d\n", line->FileName,
                    (void *)symbol->Address, symbol->Name, line->LineNumber);
        else
            fprintf(stderr, "(%-40s)\t0x%p - %s\n", "unknown", (void *)symbol->Address,
                    symbol->Name);
    }
#else
#error "TODO: implement PrintStackTrace for target"
#endif
}